

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

char * Ses_ManExtractSolution(Ses_Man_t *pSes)

{
  sat_solver *psVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  undefined1 *puVar8;
  uint local_94;
  int local_80;
  int local_7c;
  void *local_50;
  int *pPerm;
  char *p;
  char *pSol;
  int nOp;
  int d;
  int ak;
  int aj;
  int l;
  int k;
  int j;
  int i;
  int h;
  int nSol;
  Ses_Man_t *pSes_local;
  
  local_50 = (void *)0x0;
  iVar2 = pSes->nGates * 4 + 3 + pSes->nSpecFunc * (pSes->nSpecVars + 2);
  pcVar7 = (char *)calloc((long)iVar2,1);
  *pcVar7 = (char)pSes->nSpecVars;
  pcVar7[1] = (char)pSes->nSpecFunc;
  pPerm = (int *)(pcVar7 + 3);
  pcVar7[2] = (char)pSes->nGates;
  k = 0;
  do {
    if (pSes->nGates <= k) {
      if (pSes->nMaxDepth != -1) {
        local_50 = calloc((long)(pSes->nGates * pSes->nSpecVars),4);
        for (k = 0; k < pSes->nGates; k = k + 1) {
          iVar3 = (int)pcVar7[k * 4 + 5];
          iVar5 = (int)pcVar7[k * 4 + 6];
          for (ak = 0; ak < pSes->nSpecVars; ak = ak + 1) {
            if (iVar3 < pSes->nSpecVars) {
              local_7c = 0;
            }
            else {
              local_7c = *(int *)((long)local_50 +
                                 (long)((iVar3 - pSes->nSpecVars) * pSes->nSpecVars + ak) * 4);
            }
            if (iVar5 < pSes->nSpecVars) {
              local_80 = 0;
            }
            else {
              local_80 = *(int *)((long)local_50 +
                                 (long)((iVar5 - pSes->nSpecVars) * pSes->nSpecVars + ak) * 4);
            }
            if ((local_7c == 0) && (local_80 == 0)) {
              *(uint *)((long)local_50 + (long)(k * pSes->nSpecVars + ak) * 4) =
                   (uint)(ak == iVar3 || ak == iVar5);
            }
            else {
              iVar6 = Abc_MaxInt(local_7c,local_80);
              *(int *)((long)local_50 + (long)(k * pSes->nSpecVars + ak) * 4) = iVar6 + 1;
            }
          }
        }
      }
      for (j = 0; j < pSes->nSpecFunc; j = j + 1) {
        for (k = 0; k < pSes->nGates; k = k + 1) {
          psVar1 = pSes->pSat;
          iVar3 = Ses_ManOutputVar(pSes,j,k);
          iVar3 = sat_solver_var_value(psVar1,iVar3);
          if (iVar3 != 0) {
            iVar3 = Abc_Var2Lit(k,pSes->bSpecInv >> ((byte)j & 0x1f) & 1);
            *(char *)pPerm = (char)iVar3;
            pSol._4_4_ = 0;
            if (pSes->nMaxDepth != -1) {
              for (ak = 0; ak < pSes->nSpecVars; ak = ak + 1) {
                if (pSes->pArrTimeProfile == (int *)0x0) {
                  pSol._4_4_ = Abc_MaxInt(pSol._4_4_,
                                          *(int *)((long)local_50 +
                                                  (long)(k * pSes->nSpecVars + ak) * 4));
                }
                else {
                  pSol._4_4_ = Abc_MaxInt(pSol._4_4_,
                                          pSes->pArrTimeProfile[ak] +
                                          *(int *)((long)local_50 +
                                                  (long)(k * pSes->nSpecVars + ak) * 4));
                }
              }
            }
            *(char *)((long)pPerm + 1) = (char)pSol._4_4_;
            if ((pSes->pArrTimeProfile != (int *)0x0) && (pSes->fExtractVerbose != 0)) {
              printf("output %d points to gate %d and has normalized delay %d (nArrTimeDelta = %d)\n"
                     ,(ulong)(uint)j,(ulong)(uint)(pSes->nSpecVars + k),(ulong)pSol._4_4_,
                     (ulong)(uint)pSes->nArrTimeDelta);
            }
            pPerm = (int *)((long)pPerm + 2);
            for (ak = 0; ak < pSes->nSpecVars; ak = ak + 1) {
              if (pSes->nMaxDepth == -1) {
                local_94 = 0;
              }
              else {
                local_94 = *(uint *)((long)local_50 + (long)(k * pSes->nSpecVars + ak) * 4);
              }
              if ((pSes->pArrTimeProfile != (int *)0x0) && (pSes->fExtractVerbose != 0)) {
                printf("  pin-to-pin arrival time from input %d is %d (pArrTimeProfile = %d)\n",
                       (ulong)(uint)ak,(ulong)local_94,(ulong)(uint)pSes->pArrTimeProfile[ak]);
              }
              *(char *)pPerm = (char)local_94;
              pPerm = (int *)((long)pPerm + 1);
            }
          }
        }
      }
      if ((pSes->nMaxDepth != -1) && (local_50 != (void *)0x0)) {
        free(local_50);
      }
      if ((long)pPerm - (long)pcVar7 == (long)iVar2) {
        return pcVar7;
      }
      __assert_fail("( p - pSol ) == nSol",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                    ,0x6d4,"char *Ses_ManExtractSolution(Ses_Man_t *)");
    }
    psVar1 = pSes->pSat;
    iVar3 = Ses_ManGateVar(pSes,k,0,1);
    uVar4 = sat_solver_var_value(psVar1,iVar3);
    psVar1 = pSes->pSat;
    iVar3 = Ses_ManGateVar(pSes,k,1,0);
    iVar3 = sat_solver_var_value(psVar1,iVar3);
    psVar1 = pSes->pSat;
    iVar5 = Ses_ManGateVar(pSes,k,1,1);
    iVar5 = sat_solver_var_value(psVar1,iVar5);
    uVar4 = iVar5 << 2 | iVar3 << 1 | uVar4;
    puVar8 = (undefined1 *)((long)pPerm + 1);
    *(char *)pPerm = (char)uVar4;
    pPerm = (int *)((long)pPerm + 2);
    *puVar8 = 2;
    if (pSes->fExtractVerbose != 0) {
      printf("add gate %d with operation %d",(ulong)(uint)(pSes->nSpecVars + k),(ulong)uVar4);
    }
    for (aj = 0; aj < pSes->nSpecVars + k; aj = aj + 1) {
      for (l = 0; l < aj; l = l + 1) {
        psVar1 = pSes->pSat;
        iVar3 = Ses_ManSelectVar(pSes,k,l,aj);
        iVar3 = sat_solver_var_value(psVar1,iVar3);
        if (iVar3 != 0) {
          if (pSes->fExtractVerbose != 0) {
            printf(" and operands %d and %d",(ulong)(uint)l,(ulong)(uint)aj);
          }
          puVar8 = (undefined1 *)((long)pPerm + 1);
          *(char *)pPerm = (char)l;
          pPerm = (int *)((long)pPerm + 2);
          *puVar8 = (char)aj;
          aj = pSes->nSpecVars + k;
          break;
        }
      }
    }
    if (pSes->fExtractVerbose != 0) {
      if (0 < pSes->nMaxDepth) {
        printf(" and depth vector ");
        for (l = 0; l <= pSes->nArrTimeMax + k; l = l + 1) {
          psVar1 = pSes->pSat;
          iVar3 = Ses_ManDepthVar(pSes,k,l);
          uVar4 = sat_solver_var_value(psVar1,iVar3);
          printf("%d",(ulong)uVar4);
        }
      }
      printf("\n");
    }
    k = k + 1;
  } while( true );
}

Assistant:

static char * Ses_ManExtractSolution( Ses_Man_t * pSes )
{
    int nSol, h, i, j, k, l, aj, ak, d, nOp;
    char * pSol, * p;
    int * pPerm = NULL; /* will be a 2d array [i][l] where is is gate id and l is PI id */

    /* compute length of solution, for now all gates have 2 inputs */
    nSol = 3 + pSes->nGates * 4 + pSes->nSpecFunc * ( 2 + pSes->nSpecVars );

    p = pSol = ABC_CALLOC( char, nSol );

    /* header */
    *p++ = pSes->nSpecVars;
    *p++ = pSes->nSpecFunc;
    *p++ = pSes->nGates;

    /* gates */
    for ( i = 0; i < pSes->nGates; ++i )
    {
        nOp  = sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 0, 1 ) );
        nOp |= sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 1, 0 ) ) << 1;
        nOp |= sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 1, 1 ) ) << 2;

        *p++ = nOp;
        *p++ = 2;

        if ( pSes->fExtractVerbose )
            printf( "add gate %d with operation %d", pSes->nSpecVars + i, nOp );

        for ( k = 0; k < pSes->nSpecVars + i; ++k )
            for ( j = 0; j < k; ++j )
                if ( sat_solver_var_value( pSes->pSat, Ses_ManSelectVar( pSes, i, j, k ) ) )
                {
                    if ( pSes->fExtractVerbose )
                        printf( " and operands %d and %d", j, k );
                    *p++ = j;
                    *p++ = k;
                    k = pSes->nSpecVars + i;
                    break;
                }

        if ( pSes->fExtractVerbose )
        {
            if ( pSes->nMaxDepth > 0 )
            {
                printf( " and depth vector " );
                for ( j = 0; j <= pSes->nArrTimeMax + i; ++j )
                    printf( "%d", sat_solver_var_value( pSes->pSat, Ses_ManDepthVar( pSes, i, j ) ) );
            }
            printf( "\n" );
        }
    }

    /* pin-to-pin delay */
    if ( pSes->nMaxDepth != -1 )
    {
        pPerm = ABC_CALLOC( int, pSes->nGates * pSes->nSpecVars );
        for ( i = 0; i < pSes->nGates; ++i )
        {
            /* since all gates are binary for now */
            j = pSol[3 + i * 4 + 2];
            k = pSol[3 + i * 4 + 3];

            for ( l = 0; l < pSes->nSpecVars; ++l )
            {
                /* pin-to-pin delay to input l of child nodes */
                aj = j < pSes->nSpecVars ? 0 : pPerm[(j - pSes->nSpecVars) * pSes->nSpecVars + l];
                ak = k < pSes->nSpecVars ? 0 : pPerm[(k - pSes->nSpecVars) * pSes->nSpecVars + l];

                if ( aj == 0 && ak == 0 )
                    pPerm[i * pSes->nSpecVars + l] = ( l == j || l == k ) ? 1 : 0;
                else
                    pPerm[i * pSes->nSpecVars + l] = Abc_MaxInt( aj, ak ) + 1;
            }
        }
    }

    /* outputs */
    for ( h = 0; h < pSes->nSpecFunc; ++h )
        for ( i = 0; i < pSes->nGates; ++i )
            if ( sat_solver_var_value( pSes->pSat, Ses_ManOutputVar( pSes, h, i ) ) )
            {
                *p++ = Abc_Var2Lit( i, ( pSes->bSpecInv >> h ) & 1 );
                d = 0;
                if ( pSes->nMaxDepth != -1 )
                    for ( l = 0; l < pSes->nSpecVars; ++l )
                    {
                        if ( pSes->pArrTimeProfile )
                            d = Abc_MaxInt( d, pSes->pArrTimeProfile[l] + pPerm[i * pSes->nSpecVars + l] );
                        else
                            d = Abc_MaxInt( d, pPerm[i * pSes->nSpecVars + l] );
                    }
                *p++ = d;
                if ( pSes->pArrTimeProfile && pSes->fExtractVerbose )
                    printf( "output %d points to gate %d and has normalized delay %d (nArrTimeDelta = %d)\n", h, pSes->nSpecVars + i, d, pSes->nArrTimeDelta );
                for ( l = 0; l < pSes->nSpecVars; ++l )
                {
                    d = ( pSes->nMaxDepth != -1 ) ? pPerm[i * pSes->nSpecVars + l] : 0;
                    if ( pSes->pArrTimeProfile && pSes->fExtractVerbose )
                        printf( "  pin-to-pin arrival time from input %d is %d (pArrTimeProfile = %d)\n", l, d, pSes->pArrTimeProfile[l] );
                    *p++ = d;
                }
            }

    /* pin-to-pin delays */
    if ( pSes->nMaxDepth != -1 )
        ABC_FREE( pPerm );

    /* have we used all the fields? */
    assert( ( p - pSol ) == nSol );

    /* printf( "found network: " ); */
    /* Abc_TtPrintHexRev( stdout, Ses_ManDeriveTruth( pSes, pSol, 1 ), pSes->nSpecVars ); */
    /* printf( "\n" ); */

    return pSol;
}